

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall
Liby::Timestamp::toString_abi_cxx11_(string *__return_storage_ptr__,Timestamp *this)

{
  char *__s;
  long lVar1;
  size_t sVar2;
  long *plVar3;
  size_type *psVar4;
  long *in_FS_OFFSET;
  tm result;
  char usecString [48];
  
  sprintf(usecString," %06ld",(this->tv_).tv_usec);
  if ((this->tv_).tv_sec != in_FS_OFFSET[-0x814]) {
    localtime_r((time_t *)this,(tm *)&result);
    in_FS_OFFSET[-0x814] = (this->tv_).tv_sec;
    sprintf((char *)(*in_FS_OFFSET + -0x4090),"%4d.%02d.%02d - %02d:%02d:%02d -",
            (ulong)(result.tm_year + 0x76c),(ulong)(result.tm_mon + 1),(ulong)(uint)result.tm_mday,
            (ulong)(uint)result.tm_hour,(ulong)result._0_8_ >> 0x20,result._0_8_ & 0xffffffff);
  }
  lVar1 = *in_FS_OFFSET;
  __s = (char *)(lVar1 + -0x4090);
  result._0_8_ = &result.tm_mon;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,__s,lVar1 + sVar2 + -0x4090);
  plVar3 = (long *)std::__cxx11::string::append((char *)&result);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((int *)result._0_8_ != &result.tm_mon) {
    operator_delete((void *)result._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Timestamp::toString() const {
    char usecString[48];
#ifndef __linux__
    sprintf(usecString, " %06d", tv_.tv_usec);
#else
    sprintf(usecString, " %06ld", tv_.tv_usec);
#endif
    if (tv_.tv_sec != savedSec) {
        struct tm result;
        ::localtime_r(&(tv_.tv_sec), &result);
        savedSec = tv_.tv_sec;
        sprintf(savedSecString, "%4d.%02d.%02d - %02d:%02d:%02d -",
                result.tm_year + 1900, result.tm_mon + 1, result.tm_mday,
                result.tm_hour, result.tm_min, result.tm_sec);
    }
    return std::string(savedSecString) + usecString;
}